

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdKelvinUnk1dbc::adjust_orig_mthd(MthdKelvinUnk1dbc *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  byte *pbVar2;
  ulong uVar3;
  SingleMthdTest *pSVar4;
  result_type rVar5;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar5 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (uint)(byte)(this->super_SingleMthdTest).super_MthdTest.val;
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar5 & 1) != 0) {
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 & 0xf;
    }
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar5 & 1) != 0) {
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 | 1 << ((byte)rVar5 & 0x1f);
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar5 & 1) != 0) {
        rVar5 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
        *puVar1 = *puVar1 | 1 << ((byte)rVar5 & 0x1f);
      }
    }
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.surf_unk800 = 0;
  pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_g
                   + 2);
  *pbVar2 = *pbVar2 & 0xcf;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk18 = 0;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20 = 0;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk30 = 0;
  pSVar4 = &this->super_SingleMthdTest;
  uVar3._0_4_ = (pSVar4->super_MthdTest).super_StateTest.orig.idx_state_a;
  uVar3._4_4_ = (pSVar4->super_MthdTest).super_StateTest.orig.idx_state_b;
  (pSVar4->super_MthdTest).super_StateTest.orig.idx_state_a = (int)(uVar3 & 0xe0e0ffffff0fffff);
  (pSVar4->super_MthdTest).super_StateTest.orig.idx_state_b =
       (int)((uVar3 & 0xe0e0ffffff0fffff) >> 0x20);
  pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_d
                   + 3);
  *pbVar2 = *pbVar2 & 0xef;
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xff;
			if (rnd() & 1) {
				val &= 0xf;
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
		adjust_orig_bundle(&orig);
	}